

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrinter<std::optional<wasm::HeapType>_>::Print
               (Optional<wasm::HeapType> *value,ostream *os)

{
  std::operator<<(os,'(');
  if ((value->super__Optional_base<wasm::HeapType,_true,_true>)._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_engaged == false) {
    std::operator<<(os,"nullopt");
  }
  else {
    internal_stream_operator_without_lexical_name_lookup::StreamPrinter::
    PrintValue<wasm::HeapType,void,std::ostream&>((HeapType *)value,os);
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }